

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::ExtractVariables(cmCTestScriptHandler *this)

{
  bool bVar1;
  pointer pcVar2;
  string *psVar3;
  ulong uVar4;
  char *pcVar5;
  double dVar6;
  char *local_648;
  char *local_640;
  char *local_638;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  char *local_430;
  char *local_428;
  cmAlphaNum local_420;
  cmAlphaNum local_3f0;
  undefined1 local_3c0 [8];
  string msg;
  string local_398;
  allocator<char> local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  allocator<char> local_329;
  string local_328;
  cmValue local_308;
  cmValue updateVal;
  char local_2f8 [4];
  int i;
  char updateVar [40];
  allocator<char> local_2c1;
  string local_2c0;
  string *local_2a0;
  allocator<char> local_291;
  string local_290;
  string *local_270;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue contDuration;
  cmValue minInterval;
  cmCTestScriptHandler *this_local;
  
  cmValue::cmValue(&contDuration);
  cmValue::cmValue(&local_28);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CTEST_SOURCE_DIRECTORY",&local_49);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_48);
  std::__cxx11::string::operator=((string *)&this->SourceDir,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CTEST_BINARY_DIRECTORY",&local_81);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_80);
  std::__cxx11::string::operator=((string *)&this->BinaryDir,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  cmsys::SystemTools::AddKeepPath(&this->SourceDir);
  cmsys::SystemTools::AddKeepPath(&this->BinaryDir);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"CTEST_COMMAND",&local_a9);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_a8);
  std::__cxx11::string::operator=((string *)&this->CTestCmd,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CTEST_CVS_CHECKOUT",&local_d1);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_d0);
  std::__cxx11::string::operator=((string *)&this->CVSCheckOut,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CTEST_DASHBOARD_ROOT",&local_f9);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_f8);
  std::__cxx11::string::operator=((string *)&this->CTestRoot,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"CTEST_UPDATE_COMMAND",&local_121);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_120);
  std::__cxx11::string::operator=((string *)&this->UpdateCmd,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       (&this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"CTEST_CVS_COMMAND",&local_149);
    psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_148);
    std::__cxx11::string::operator=((string *)&this->UpdateCmd,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CTEST_ENVIRONMENT",&local_171);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_170);
  std::__cxx11::string::operator=((string *)&this->CTestEnv,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CTEST_INITIAL_CACHE",&local_199);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_198);
  std::__cxx11::string::operator=((string *)&this->InitialCache,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"CTEST_CMAKE_COMMAND",&local_1c1);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_1c0);
  std::__cxx11::string::operator=((string *)&this->CMakeCmd,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"CTEST_CMAKE_OUTPUT_FILE_NAME",&local_1e9);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar2,&local_1e8);
  std::__cxx11::string::operator=((string *)&this->CMOutFile,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"CTEST_BACKUP_AND_RESTORE",&local_211);
  bVar1 = cmMakefile::IsOn(pcVar2,&local_210);
  this->Backup = bVar1;
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY",&local_239);
  bVar1 = cmMakefile::IsOn(pcVar2,&local_238);
  this->EmptyBinDir = bVar1;
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE",&local_261);
  bVar1 = cmMakefile::IsOn(pcVar2,&local_260);
  this->EmptyBinDirOnce = bVar1;
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"CTEST_CONTINUOUS_MINIMUM_INTERVAL",&local_291);
  local_270 = (string *)cmMakefile::GetDefinition(pcVar2,&local_290);
  contDuration.Value = local_270;
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     (&this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"CTEST_CONTINUOUS_DURATION",&local_2c1);
  local_2a0 = (string *)cmMakefile::GetDefinition(pcVar2,&local_2c0);
  local_28 = (cmValue)local_2a0;
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  updateVal.Value._4_4_ = 1;
  do {
    if (9 < (int)updateVal.Value._4_4_) {
      if (((this->Backup & 1U) == 0) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) == 0) &&
           ((uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0 &&
            (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)))) {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) != 0) {
            cmsys::SystemTools::GetFilenamePath(&local_470,&this->SourceDir);
            std::__cxx11::string::operator=((string *)&this->CTestRoot,(string *)&local_470);
            std::__cxx11::string::~string((string *)&local_470);
          }
          bVar1 = cmValue::operator_cast_to_bool(&contDuration);
          if (bVar1) {
            cmValue::operator->[abi_cxx11_(&contDuration);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            dVar6 = atof(pcVar5);
            this->MinimumInterval = dVar6 * 60.0;
          }
          bVar1 = cmValue::operator_cast_to_bool(&local_28);
          if (bVar1) {
            cmValue::operator->[abi_cxx11_(&local_28);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            dVar6 = atof(pcVar5);
            this->ContinuousDuration = dVar6 * 60.0;
          }
          UpdateElapsedTime(this);
          this_local._4_4_ = 0;
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_3f0,"CTEST_SOURCE_DIRECTORY = ");
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_638 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_638 = "(Null)";
          }
          cmAlphaNum::cmAlphaNum(&local_420,local_638);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_640 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_640 = "(Null)";
          }
          local_428 = local_640;
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_648 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_648 = "(Null)";
          }
          local_430 = local_648;
          cmStrCat<char[27],char_const*,char[18],char_const*>
                    ((string *)local_3c0,&local_3f0,&local_420,
                     (char (*) [27])"\nCTEST_BINARY_DIRECTORY = ",&local_428,
                     (char (*) [18])"\nCTEST_COMMAND = ",&local_430);
          std::operator+(&local_450,
                         "Some required settings in the configuration file were missing:\n",
                         (string *)local_3c0);
          cmSystemTools::Error(&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          this_local._4_4_ = 4;
          std::__cxx11::string::~string((string *)local_3c0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,
                   "Backup was requested without specifying CTEST_CVS_CHECKOUT.",
                   (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        cmSystemTools::Error(&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        this_local._4_4_ = 3;
      }
      return this_local._4_4_;
    }
    snprintf(local_2f8,0x28,"CTEST_EXTRA_UPDATES_%i",(ulong)updateVal.Value._4_4_);
    pcVar2 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       (&this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,local_2f8,&local_329);
    local_308 = cmMakefile::GetDefinition(pcVar2,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    bVar1 = cmValue::operator_cast_to_bool(&local_308);
    if (bVar1) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,local_2f8,&local_371);
        std::operator+(&local_350,&local_370," specified without specifying CTEST_CVS_COMMAND.");
        cmSystemTools::Error(&local_350);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator(&local_371);
        return 0xc;
      }
      psVar3 = cmValue::operator*[abi_cxx11_(&local_308);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->ExtraUpdates,psVar3);
    }
    updateVal.Value._4_4_ = updateVal.Value._4_4_ + 1;
  } while( true );
}

Assistant:

int cmCTestScriptHandler::ExtractVariables()
{
  // Temporary variables
  cmValue minInterval;
  cmValue contDuration;

  this->SourceDir =
    this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
  this->BinaryDir =
    this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");

  // add in translations for src and bin
  cmSystemTools::AddKeepPath(this->SourceDir);
  cmSystemTools::AddKeepPath(this->BinaryDir);

  this->CTestCmd = this->Makefile->GetSafeDefinition("CTEST_COMMAND");
  this->CVSCheckOut = this->Makefile->GetSafeDefinition("CTEST_CVS_CHECKOUT");
  this->CTestRoot = this->Makefile->GetSafeDefinition("CTEST_DASHBOARD_ROOT");
  this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_UPDATE_COMMAND");
  if (this->UpdateCmd.empty()) {
    this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_CVS_COMMAND");
  }
  this->CTestEnv = this->Makefile->GetSafeDefinition("CTEST_ENVIRONMENT");
  this->InitialCache =
    this->Makefile->GetSafeDefinition("CTEST_INITIAL_CACHE");
  this->CMakeCmd = this->Makefile->GetSafeDefinition("CTEST_CMAKE_COMMAND");
  this->CMOutFile =
    this->Makefile->GetSafeDefinition("CTEST_CMAKE_OUTPUT_FILE_NAME");

  this->Backup = this->Makefile->IsOn("CTEST_BACKUP_AND_RESTORE");
  this->EmptyBinDir =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY");
  this->EmptyBinDirOnce =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE");

  minInterval =
    this->Makefile->GetDefinition("CTEST_CONTINUOUS_MINIMUM_INTERVAL");
  contDuration = this->Makefile->GetDefinition("CTEST_CONTINUOUS_DURATION");

  char updateVar[40];
  int i;
  for (i = 1; i < 10; ++i) {
    snprintf(updateVar, sizeof(updateVar), "CTEST_EXTRA_UPDATES_%i", i);
    cmValue updateVal = this->Makefile->GetDefinition(updateVar);
    if (updateVal) {
      if (this->UpdateCmd.empty()) {
        cmSystemTools::Error(
          std::string(updateVar) +
          " specified without specifying CTEST_CVS_COMMAND.");
        return 12;
      }
      this->ExtraUpdates.emplace_back(*updateVal);
    }
  }

  // in order to backup and restore we also must have the cvs root
  if (this->Backup && this->CVSCheckOut.empty()) {
    cmSystemTools::Error(
      "Backup was requested without specifying CTEST_CVS_CHECKOUT.");
    return 3;
  }

  // make sure the required info is here
  if (this->SourceDir.empty() || this->BinaryDir.empty() ||
      this->CTestCmd.empty()) {
    std::string msg =
      cmStrCat("CTEST_SOURCE_DIRECTORY = ",
               (!this->SourceDir.empty()) ? this->SourceDir.c_str() : "(Null)",
               "\nCTEST_BINARY_DIRECTORY = ",
               (!this->BinaryDir.empty()) ? this->BinaryDir.c_str() : "(Null)",
               "\nCTEST_COMMAND = ",
               (!this->CTestCmd.empty()) ? this->CTestCmd.c_str() : "(Null)");
    cmSystemTools::Error(
      "Some required settings in the configuration file were missing:\n" +
      msg);
    return 4;
  }

  // if the dashboard root isn't specified then we can compute it from the
  // this->SourceDir
  if (this->CTestRoot.empty()) {
    this->CTestRoot = cmSystemTools::GetFilenamePath(this->SourceDir);
  }

  // the script may override the minimum continuous interval
  if (minInterval) {
    this->MinimumInterval = 60 * atof(minInterval->c_str());
  }
  if (contDuration) {
    this->ContinuousDuration = 60.0 * atof(contDuration->c_str());
  }

  this->UpdateElapsedTime();

  return 0;
}